

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall lzham::lzcompressor::compress_block(lzcompressor *this,void *pBuf,uint buf_len)

{
  symbol_codec *this_00;
  vector<unsigned_char> *other;
  lzdecision *plVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  lzdecision *plVar4;
  undefined4 uVar6;
  uchar *puVar5;
  search_accelerator *dict;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  void *pData_ptr;
  void *extraout_RDX;
  void *pData_ptr_00;
  void *extraout_RDX_00;
  uint uVar10;
  ulong uVar11;
  uint parse_thread_index;
  ulong uVar12;
  uint64 data;
  long lVar13;
  bool bVar14;
  lzdecision lzdec;
  uint bytes_to_match;
  uint cur_dict_ofs;
  state *local_88;
  ulong local_80;
  ulong local_78;
  uint local_70;
  uint local_6c;
  ulong local_68;
  search_accelerator *local_60;
  ulong local_58;
  state *local_50;
  semaphore *local_48;
  void *local_40;
  state *local_38;
  
  if (this->m_src_size < 0) {
    return false;
  }
  uVar12 = (ulong)buf_len;
  this->m_src_size = this->m_src_size + uVar12;
  bVar7 = search_accelerator::add_bytes_begin(&this->m_accel,buf_len,(uint8 *)pBuf);
  if (bVar7) {
    local_60 = &this->m_accel;
    uVar8 = adler32(pBuf,uVar12,this->m_src_adler32);
    this->m_src_adler32 = uVar8;
    uVar10 = (this->m_accel).m_max_dict_size - 1 & (this->m_accel).m_lookahead_pos;
    this->m_block_start_dict_ofs = uVar10;
    this_00 = &this->m_codec;
    bytes_to_match = buf_len;
    cur_dict_ofs = uVar10;
    bVar7 = symbol_codec::start_encoding(this_00,buf_len * 9 >> 3);
    if ((bVar7) &&
       (((this->m_block_index != 0 || (bVar7 = send_configuration(this), bVar7)) &&
        (bVar7 = symbol_codec::encode_bits(this_00,1,2), bVar7)))) {
      bVar7 = symbol_codec::encode_arith_init(this_00);
      if (!bVar7) {
        return false;
      }
      local_88 = &this->m_state;
      (this->m_state).super_state_base.m_match_hist[3] = 1;
      (this->m_state).super_state_base.m_cur_state = 0;
      (this->m_state).super_state_base.m_match_hist[0] = 1;
      (this->m_state).super_state_base.m_match_hist[1] = 1;
      (this->m_state).super_state_base.m_match_hist[2] = 1;
      (this->m_state).super_state_base.m_cur_ofs = uVar10;
      (this->m_state).m_block_start_dict_ofs = uVar10;
      local_50 = &this->m_initial_state;
      local_58 = uVar12;
      state::operator=(local_50,local_88);
      local_70 = this->m_step;
      local_48 = &this->m_parse_jobs_complete;
      local_38 = &this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state;
      local_68 = (ulong)buf_len;
      while (dict = local_60, uVar12 = local_68, buf_len != 0) {
        local_80 = (ulong)(buf_len + 0xbff) / 0xc00;
        if (this->m_num_parse_threads < (uint)local_80) {
          local_80 = (ulong)this->m_num_parse_threads;
        }
        if (((((this->m_params).m_lzham_compress_flags & 4) == 0) && (this->m_use_task_pool == true)
            ) && (((this->m_accel).m_max_helper_threads != 0 &&
                  (uVar10 = (int)local_80 + (int)(this->m_accel).m_num_completed_helper_threads,
                  local_80 = (ulong)uVar10, 7 < uVar10)))) {
          local_80 = 8;
        }
        bVar14 = this->m_block_index == 0;
        uVar10 = cur_dict_ofs - this->m_block_start_dict_ofs;
        bVar7 = uVar10 < 0xc00;
        pData_ptr = (void *)(ulong)CONCAT31((int3)(uVar10 >> 8),bVar7);
        if (buf_len < 0x600) {
          local_80 = 1;
        }
        if (bVar14 && bVar7) {
          local_80 = 1;
        }
        uVar10 = (int)local_80 * 0xc00;
        if (buf_len < uVar10) {
          uVar10 = buf_len;
        }
        local_6c = 0x600;
        if (uVar10 < 0x600) {
          local_6c = uVar10;
        }
        if (!bVar14 || !bVar7) {
          local_6c = uVar10;
        }
        local_40 = (void *)(ulong)((int)local_80 - 1);
        lVar13 = local_80 * 0xb2b00;
        local_78 = (long)local_40 * 0xb2b00;
        uVar8 = cur_dict_ofs;
        uVar10 = local_6c;
        for (uVar12 = 0; uVar11 = local_80, lVar13 - uVar12 != 0; uVar12 = uVar12 + 0xb2b00) {
          state::operator=((state *)((long)(local_38->super_state_base).m_match_hist + (uVar12 - 8))
                           ,local_88);
          *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state.
                          super_state_base.m_match_hist + (uVar12 - 8)) = uVar8;
          if (uVar12 != 0) {
            *(undefined4 *)
             ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state.
                    super_state_base.m_match_hist + uVar12 + 0xc) = 1;
            puVar2 = (undefined8 *)
                     ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                            m_approx_state.super_state_base.m_match_hist + (uVar12 - 4));
            *puVar2 = 0x100000000;
            puVar2[1] = 0x100000001;
          }
          (&this->m_parse_thread_state[0].super_raw_parse_thread_state.m_issued_reset_state_partial)
          [uVar12] = uVar12 != 0;
          *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state.
                          super_state_base.m_match_hist + (uVar12 - 0x10)) = uVar8;
          pData_ptr = extraout_RDX;
          uVar9 = uVar10;
          if (local_78 != uVar12) {
            uVar9 = local_6c / (uint)local_80;
            pData_ptr = (void *)((ulong)local_6c % (local_80 & 0xffffffff));
          }
          if (0xbff < uVar9) {
            uVar9 = 0xc00;
          }
          *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state.
                          super_state_base.m_match_hist + (uVar12 - 0xc)) = uVar9;
          uVar8 = uVar8 + uVar9;
          uVar10 = uVar10 - uVar9;
        }
        if (((uint)local_80 < 2) || (this->m_use_task_pool == false)) {
          this->m_parse_jobs_remaining = 0x7fffffff;
          for (data = 0; uVar11 != data; data = data + 1) {
            parse_job_callback(this,data,pData_ptr);
            pData_ptr = extraout_RDX_00;
          }
        }
        else {
          this->m_parse_jobs_remaining = local_80;
          bVar7 = task_pool::
                  queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                            ((this->m_params).m_pTask_pool,this,0x1112ea,0,1,local_40);
          if (!bVar7) {
            return false;
          }
          parse_job_callback(this,0,pData_ptr_00);
          semaphore::wait(local_48,(void *)0xffffffffffffffff);
        }
        uVar12 = 0;
        while (buf_len = bytes_to_match, uVar12 != uVar11) {
          if (this->m_parse_thread_state[uVar12].super_raw_parse_thread_state.m_failed != false) {
            return false;
          }
          if (this->m_parse_thread_state[uVar12].super_raw_parse_thread_state.
              m_issued_reset_state_partial == true) {
            bVar7 = state::encode_reset_state_partial(local_88,this_00,local_60);
            if (!bVar7) {
              return false;
            }
            this->m_step = this->m_step + 1;
          }
          uVar8 = this->m_parse_thread_state[uVar12].super_raw_parse_thread_state.m_best_decisions.
                  m_size;
          local_78 = uVar12;
          if (uVar8 != 0) {
            uVar10 = uVar8 - 1;
            bVar7 = this->m_parse_thread_state[uVar12].super_raw_parse_thread_state.
                    m_emit_decisions_backwards;
            uVar11 = (ulong)uVar10;
            if (bVar7 == false) {
              uVar11 = (ulong)bVar7;
            }
            if (bVar7 != false) {
              uVar10 = 0;
            }
            do {
              plVar4 = this->m_parse_thread_state[uVar12].super_raw_parse_thread_state.
                       m_best_decisions.m_p;
              plVar1 = plVar4 + uVar11;
              uVar3 = plVar1->m_pos;
              uVar6 = plVar1->m_len;
              lzdec.m_len = uVar6;
              lzdec.m_pos = uVar3;
              lzdec.m_dist = plVar4[uVar11].m_dist;
              bVar14 = code_decision(this,lzdec,&cur_dict_ofs,&bytes_to_match);
              if (!bVar14) {
                return false;
              }
              uVar9 = (int)uVar11 + (-(uint)bVar7 | 1);
              uVar11 = (ulong)uVar9;
            } while (uVar10 + (-(uint)bVar7 | 1) != uVar9);
          }
          uVar11 = local_80;
          uVar12 = local_78 + 1;
        }
      }
      search_accelerator::add_bytes_end(local_60);
      bVar7 = state::encode_eob(local_88,this_00,dict);
      if ((bVar7) && (bVar7 = symbol_codec::stop_encoding(this_00,true), bVar7)) {
        if ((uint)uVar12 <= (this->m_codec).m_output_buf.m_size) {
          state::operator=(local_88,local_50);
          this->m_step = local_70;
          symbol_codec::clear(this_00);
          bVar7 = symbol_codec::start_encoding(this_00,(uint)uVar12 + 0x10);
          if (!bVar7) {
            return false;
          }
          if ((this->m_block_index == 0) && (bVar7 = send_configuration(this), !bVar7)) {
            return false;
          }
          bVar7 = symbol_codec::encode_bits(this_00,2,2);
          if (!bVar7) {
            return false;
          }
          bVar7 = symbol_codec::encode_bits(this_00,(int)local_68 - 1,0x18);
          if (!bVar7) {
            return false;
          }
          bVar7 = symbol_codec::encode_align_to_byte(this_00);
          if (!bVar7) {
            return false;
          }
          uVar10 = this->m_block_start_dict_ofs;
          puVar5 = (this->m_accel).m_dict.m_p;
          for (lVar13 = 0; (int)local_58 != (int)lVar13; lVar13 = lVar13 + 1) {
            bVar7 = symbol_codec::encode_bits(this_00,(uint)puVar5[lVar13 + (ulong)uVar10],8);
            if (!bVar7) {
              return false;
            }
          }
          bVar7 = symbol_codec::stop_encoding(this_00,true);
          if (!bVar7) {
            return false;
          }
        }
        other = &(this->m_codec).m_output_buf;
        if ((this->m_comp_buf).m_size == 0) {
          vector<unsigned_char>::swap(&this->m_comp_buf,other);
        }
        else {
          bVar7 = vector<unsigned_char>::append(&this->m_comp_buf,other);
          if (!bVar7) {
            return false;
          }
        }
        this->m_block_index = this->m_block_index + 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool lzcompressor::compress_block(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
         return false;

      m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
         return false;

      if (!m_block_index)
      {
         if (!send_configuration())
            return false;
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
         return false;

      if (!m_codec.encode_arith_init())
         return false;

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      m_initial_state = m_state;

      coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

#if 0
#ifdef LZHAM_LZVERIFY
      // TODO: This no longer works.
      lzham::vector<lzdecision> lzdecisions0;
      if (!lzdecisions0.try_reserve(64))
         return false;

      for (uint i = 0; i < bytes_to_match; i++)
      {
         uint cur_dict_ofs = m_block_start_dict_ofs + i;
         int largest_match_index = enumerate_lz_decisions(cur_dict_ofs, m_state, lzdecisions0, 1);
         if (largest_match_index < 0)
            return false;

         bit_cost_t largest_match_cost = lzdecisions0[largest_match_index].m_cost;
         uint largest_match_len = lzdecisions0[largest_match_index].get_len();

         for (uint j = 0; j < lzdecisions0.size(); j++)
         {
            const lzdecision& lzdec = lzdecisions0[j];

            if (lzdec.is_match())
            {
               uint match_dist = lzdec.get_match_dist(m_state);

               for (uint k = 0; k < lzdec.get_len(); k++)
               {
                  LZHAM_VERIFY(m_accel[cur_dict_ofs+k] == m_accel[(cur_dict_ofs+k - match_dist) & (m_accel.get_max_dict_size() - 1)]);
               }
            }
         }
      }
#endif
#endif

      while (bytes_to_match)
      {
         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of parser threads as the match finder finishes up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }
         if (bytes_to_match < 1536)
            num_parse_jobs = 1;

         // Reduce block size near the beginning of the file so statistical models get going a bit faster.
         bool force_small_block = false;
         if ( (!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes) )
         {
            num_parse_jobs = 1;
            force_small_block = true;
         }

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);
         if (force_small_block)
         {
            parse_thread_total_size = LZHAM_MIN(parse_thread_total_size, 1536);
         }

         uint parse_thread_remaining = parse_thread_total_size;
         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            parse_thread.m_approx_state = m_state;
            parse_thread.m_approx_state.m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_approx_state.reset_state_partial();
               parse_thread.m_issued_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issued_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               m_parse_jobs_remaining = num_parse_jobs;

               {
                  scoped_perf_section queue_task_timer("queing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);

               {
                  scoped_perf_section wait_timer("waiting for jobs");

                  m_parse_jobs_complete.wait();
               }
            }
            else
            {
               m_parse_jobs_remaining = INT_MAX;
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         {
            scoped_perf_section coding_timer("coding");

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];
               if (parse_thread.m_failed)
                  return false;

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issued_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel))
                     return false;
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {

                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;

                     dec_step = -1;
                  }

                  LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                        return false;
                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_to_match);

            } // parse_thread_index

         }
      }

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel))
         return false;

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12)) return false;
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true)) return false;
      }

      uint compressed_size = m_codec.get_encoding_buf().size();
      compressed_size;

#if defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG)
      if (0)
#else
      if (compressed_size >= buf_len)
#endif
      {
         m_state = m_initial_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.clear();

         if (!m_codec.start_encoding(buf_len + 16)) return false;

         if (!m_block_index)
         {
            if (!send_configuration())
               return false;
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12)) return false;
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits)) return false;

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24)) return false;
         if (!m_codec.encode_align_to_byte()) return false;

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8)) return false;
         }

         if (!m_codec.stop_encoding(true)) return false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
               return false;
         }
      }
#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
#endif

      m_block_index++;

      return true;
   }